

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

SPIREntryPoint * __thiscall
spirv_cross::Compiler::get_entry_point(Compiler *this,string *name,ExecutionModel model)

{
  ExecutionModel EVar1;
  __type _Var2;
  CompilerError *this_00;
  __node_base *p_Var3;
  allocator local_11d;
  ExecutionModel local_11c;
  pair<unsigned_int,_spirv_cross::SPIREntryPoint> local_118;
  
  p_Var3 = &(this->ir).entry_points._M_h._M_before_begin;
  local_11c = model;
  do {
    while( true ) {
      p_Var3 = p_Var3->_M_nxt;
      if (p_Var3 == (__node_base *)0x0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_118,"Entry point does not exist.",&local_11d);
        CompilerError::CompilerError(this_00,(string *)&local_118);
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::pair<unsigned_int,_spirv_cross::SPIREntryPoint>::
      pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_true>
                (&local_118,
                 (pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>
                  *)(p_Var3 + 1));
      _Var2 = ::std::operator==(&local_118.second.orig_name,name);
      EVar1 = local_118.second.model;
      if (_Var2) break;
      SPIREntryPoint::~SPIREntryPoint(&local_118.second);
    }
    SPIREntryPoint::~SPIREntryPoint(&local_118.second);
  } while (EVar1 != local_11c);
  return (SPIREntryPoint *)(p_Var3 + 2);
}

Assistant:

SPIREntryPoint &Compiler::get_entry_point(const std::string &name, ExecutionModel model)
{
	auto itr = find_if(begin(ir.entry_points), end(ir.entry_points),
	                   [&](const std::pair<uint32_t, SPIREntryPoint> &entry) -> bool {
		                   return entry.second.orig_name == name && entry.second.model == model;
	                   });

	if (itr == end(ir.entry_points))
		SPIRV_CROSS_THROW("Entry point does not exist.");

	return itr->second;
}